

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::throwLogicError(string *message,SourceLineInfo *locationInfo)

{
  ostream *poVar1;
  logic_error *this;
  ostringstream oss;
  string local_1b8 [32];
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  operator<<((ostream *)local_198,locationInfo);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,": Internal Catch error: \'",0x19);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(message->_M_dataplus)._M_p,message->_M_string_length);
  local_1b8[0] = (string)0x27;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_1b8,1);
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::logic_error::logic_error(this,local_1b8);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void throwLogicError( std::string const& message, SourceLineInfo const& locationInfo ) {
        std::ostringstream oss;
        oss << locationInfo << ": Internal Catch error: '" << message << '\'';
        if( alwaysTrue() )
            throw std::logic_error( oss.str() );
    }